

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O1

int countNamelessRecords(int m,int firstcode)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  
  uVar2 = firstNamelessRecord(m,firstcode);
  piVar4 = &TERRITORY_BOUNDARIES[m].flags;
  uVar1 = *piVar4;
  iVar3 = m + ~uVar2;
  do {
    uVar2 = *piVar4;
    iVar3 = iVar3 + 1;
    piVar4 = piVar4 + 5;
  } while ((uVar2 & 0x1f) + ((uVar2 & 0x1f) / 5) * 5 + 1 ==
           (uVar1 & 0x1f) + ((uVar1 & 0x1f) / 5) * 5 + 1);
  return iVar3;
}

Assistant:

static int countNamelessRecords(const int m, const int firstcode) {
    const int first = firstNamelessRecord(m, firstcode);
    const int codexm = coDex(m);
    int last = m;
    ASSERT((0 <= m) && (m <= MAPCODE_BOUNDARY_MAX));
    ASSERT((0 <= firstcode) && (firstcode <= MAPCODE_BOUNDARY_MAX));
    while (coDex(last) == codexm) {
        last++;
    }
    ASSERT((0 <= last) && (last <= MAPCODE_BOUNDARY_MAX));
    ASSERT(last >= first);
    return (last - first);
}